

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O3

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::DeferredTypeHandlerBase::
ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity,BOOL isProto)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  PropertyTypes values;
  bool bVar2;
  int iVar3;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_00;
  undefined4 *puVar4;
  
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::New
                      (scriptContext->recycler,initSlotCapacity,
                       (this->super_DynamicTypeHandler).inlineSlotCapacity,
                       (this->super_DynamicTypeHandler).offsetOfInlineSlots,false,false);
  DynamicTypeHandler::SetSingletonInstanceIfNeeded(&this_00->super_DynamicTypeHandler,instance);
  DynamicObject::EnsureSlots
            (instance,0,(this_00->super_DynamicTypeHandler).slotCapacity,scriptContext,
             &this_00->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags
            (&this_00->super_DynamicTypeHandler,(this->super_DynamicTypeHandler).flags & 0x20);
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&this_00->super_DynamicTypeHandler,0xf0,values);
  iVar3 = (*(instance->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(instance);
  if ((char)iVar3 != '\0') {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this_00->super_DynamicTypeHandler,false);
  }
  if (isProto == 0) {
    DynamicTypeHandler::SetInstanceTypeHandler(&this_00->super_DynamicTypeHandler,instance,true);
  }
  else {
    (*(this_00->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52])(this_00,instance);
    DynamicTypeHandler::SetInstanceTypeHandler(&this_00->super_DynamicTypeHandler,instance,true);
    if (*(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> **)
         ((instance->super_RecyclableObject).type.ptr + 1) != this_00) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                  ,0x8a,
                                  "(!isProto || instance->GetDynamicType()->GetTypeHandler() == newTypeHandler)"
                                  ,
                                  "Why did SetIsPrototype force a type handler change on a non-shared type handler?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return this_00;
}

Assistant:

T* DeferredTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance, int initSlotCapacity, BOOL isProto)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        // Create new type handler, allowing slotCapacity round up here. We'll allocate instance slots below.
        T* newTypeHandler = T::New(recycler, initSlotCapacity, GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
#if ENABLE_FIXED_FIELDS
        newTypeHandler->SetSingletonInstanceIfNeeded(instance);
#endif
        // EnsureSlots before updating the type handler and instance, as EnsureSlots allocates and may throw.
        instance->EnsureSlots(0, newTypeHandler->GetSlotCapacity(), scriptContext, newTypeHandler);
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
        {
            newTypeHandler->ClearHasOnlyWritableDataProperties();
        }

        if (isProto)
        {
            newTypeHandler->SetIsPrototype(instance);
        }

        newTypeHandler->SetInstanceTypeHandler(instance);
        AssertMsg(!isProto || instance->GetDynamicType()->GetTypeHandler() == newTypeHandler, "Why did SetIsPrototype force a type handler change on a non-shared type handler?");

        return newTypeHandler;
    }